

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

char * anon_unknown.dwarf_49742::ReadAttribute
                 (string *name,string *ty,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data,char *ptr)

{
  bool bVar1;
  reference __dest;
  uint local_3c;
  uint *puStack_38;
  int dataLen;
  char *p;
  char *ptr_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  string *ty_local;
  string *name_local;
  
  if (*ptr == '\0') {
    name_local = (string *)0x0;
  }
  else {
    p = ptr;
    ptr_local = (char *)data;
    data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ty;
    ty_local = name;
    puStack_38 = (uint *)ReadString(name,ptr);
    puStack_38 = (uint *)ReadString((string *)data_local,(char *)puStack_38);
    local_3c = *puStack_38;
    puStack_38 = puStack_38 + 1;
    bVar1 = IsBigEndian();
    if (bVar1) {
      swap4(&local_3c);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr_local,
               (long)(int)local_3c);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr_local,0);
    memcpy(__dest,puStack_38,(long)(int)local_3c);
    name_local = (string *)((long)puStack_38 + (long)(int)local_3c);
  }
  return (char *)name_local;
}

Assistant:

const char *ReadAttribute(std::string &name, std::string &ty,
                          std::vector<unsigned char> &data, const char *ptr) {

  if ((*ptr) == 0) {
    // end of attribute.
    return NULL;
  }

  const char *p = ReadString(name, ptr);

  p = ReadString(ty, p);

  int dataLen;
  memcpy(&dataLen, p, sizeof(int));
  p += 4;

  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&dataLen));
  }

  data.resize(dataLen);
  memcpy(&data.at(0), p, dataLen);
  p += dataLen;

  return p;
}